

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

void __thiscall Text::createTexture(Text *this)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  pointer puVar4;
  bool bVar5;
  undefined8 in_RAX;
  void *pvVar6;
  long lVar7;
  long lVar8;
  GLuint local_24 [2];
  GLuint textureId;
  
  local_24[0] = (GLuint)((ulong)in_RAX >> 0x20);
  (*glad_glGenTextures)(1,local_24);
  (*glad_glBindTexture)(0xde1,local_24[0]);
  (*glad_glTexParameteri)(0xde1,0x2802,0x2900);
  (*glad_glTexParameteri)(0xde1,0x2803,0x2900);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  bVar5 = operator==(&this->_color,&FONT_COLOR_WHITE);
  if (bVar5) {
    (*glad_glTexImage2D)
              (0xde1,0,0x1906,(GLsizei)(this->_font).tex_width,(GLsizei)(this->_font).tex_height,0,
               0x1906,0x1401,
               (this->_font).tex_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  else {
    puVar4 = (this->_font).tex_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)(this->_font).tex_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar4;
    pvVar6 = operator_new__(lVar8 * 4);
    uVar1 = (this->_color).r;
    uVar2 = (this->_color).g;
    uVar3 = (this->_color).b;
    for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
      *(uint8_t *)((long)pvVar6 + lVar7 * 4) = uVar1;
      *(uint8_t *)((long)pvVar6 + lVar7 * 4 + 1) = uVar2;
      *(uint8_t *)((long)pvVar6 + lVar7 * 4 + 2) = uVar3;
      *(uchar *)((long)pvVar6 + lVar7 * 4 + 3) = puVar4[lVar7];
    }
    (*glad_glTexImage2D)
              (0xde1,0,0x1908,(GLsizei)(this->_font).tex_width,(GLsizei)(this->_font).tex_height,0,
               0x1908,0x1401,pvVar6);
  }
  Texture::loadExisting
            (&this->_texture,(GLsizei)(this->_font).tex_width,(GLsizei)(this->_font).tex_height,
             local_24[0]);
  return;
}

Assistant:

void Text::createTexture() {
    GLuint textureId;
    glGenTextures(1, &textureId);
    glBindTexture(GL_TEXTURE_2D, textureId);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);

    // Optimization for white text
    if (_color == FONT_COLOR_WHITE) {
        // Use 8bit alpha only texture to save memory
        glTexImage2D(GL_TEXTURE_2D, 0, GL_ALPHA, (GLsizei)_font.tex_width, (GLsizei)_font.tex_height, 0, GL_ALPHA, GL_UNSIGNED_BYTE, &_font.tex_data[0]);
    } else {
        // Convert the texture data to 32bit RGBA
        size_t currentSize = _font.tex_data.size();
        size_t newSize = _font.tex_data.size() * 4;
        uint8_t* rgbData = new uint8_t[newSize];
        for (size_t i = 0; i < currentSize; i+=1) {
            rgbData[(i*4)]   = _color.r;
            rgbData[(i*4)+1] = _color.g;
            rgbData[(i*4)+2] = _color.b;
            rgbData[(i*4)+3] = _font.tex_data[i];
        }
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, (GLsizei)_font.tex_width, (GLsizei)_font.tex_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, rgbData);
    }

    _texture.loadExisting((GLsizei)_font.tex_width, (GLsizei)_font.tex_height, textureId);
}